

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagecodec.hpp
# Opt level: O3

vec4 ImageCodec::decodeFLOAT_SINTVec<signed_char,1>(ImageCodec *param_1,void *ptr)

{
  float fVar1;
  vec4 vVar2;
  
  fVar1 = -1.0;
  if (-1.0 <= (float)(int)*ptr / 255.0) {
    fVar1 = (float)(int)*ptr / 255.0;
  }
  vVar2.field_0.field_0.y = 0.0;
  vVar2.field_0.field_0.x = fVar1;
  vVar2.field_0._8_8_ = 0x3f80000000000000;
  return (vec4)vVar2.field_0;
}

Assistant:

static glm::vec4 decodeFLOAT_SINTVec(const ImageCodec*, const void* ptr) {
        static_assert(std::is_signed_v<TYPE>);
        static_assert((COMPONENTS > 0) && (COMPONENTS <= 4));
        auto data = reinterpret_cast<const TYPE*>(ptr);
        const auto upper = static_cast<float>((128u << sizeof(TYPE)) - 1u);
        glm::vec4 result(0.f, 0.f, 0.f, 1.f);
        for (int i = 0; i < COMPONENTS; ++i)
            result[i] = std::max(static_cast<float>(data[i]) / upper, -1.f);
        return result;
    }